

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::delete_global_var(CVmObjTable *this,vm_globalvar_t *var)

{
  void *in_RSI;
  long in_RDI;
  
  if (*(long *)((long)in_RSI + 0x10) != 0) {
    *(undefined8 *)(*(long *)((long)in_RSI + 0x10) + 0x18) = *(undefined8 *)((long)in_RSI + 0x18);
  }
  if (*(long *)((long)in_RSI + 0x18) == 0) {
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)((long)in_RSI + 0x10);
  }
  else {
    *(undefined8 *)(*(long *)((long)in_RSI + 0x18) + 0x10) = *(undefined8 *)((long)in_RSI + 0x10);
  }
  if (in_RSI != (void *)0x0) {
    operator_delete(in_RSI,0x20);
  }
  return;
}

Assistant:

void CVmObjTable::delete_global_var(vm_globalvar_t *var)
{
    /* unlink it from the list of globals */
    if (var->nxt != 0)
        var->nxt->prv = var->prv;

    if (var->prv != 0)
        var->prv->nxt = var->nxt;
    else
        global_var_head_ = var->nxt;

    /* delete the memory */
    delete var;
}